

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

nng_stat * nng_stat_find_scope(nng_stat *stat,char *name,int id)

{
  int iVar1;
  nng_stat *pnVar2;
  nng_stat *result;
  nng_stat *child;
  int id_local;
  char *name_local;
  nng_stat *stat_local;
  
  if ((stat == (nng_stat *)0x0) || (stat->s_info->si_type != NNG_STAT_SCOPE)) {
    stat_local = (nng_stat *)0x0;
  }
  else if ((((stat->s_val).sv_id != id) || (stat->s_info->si_type != NNG_STAT_SCOPE)) ||
          (iVar1 = strcmp(name,stat->s_info->si_name), stat_local = stat, iVar1 != 0)) {
    for (result = (nng_stat *)nni_list_first(&stat->s_children); result != (nng_stat *)0x0;
        result = (nng_stat *)nni_list_next(&stat->s_children,result)) {
      pnVar2 = nng_stat_find_scope(result,name,id);
      if (pnVar2 != (nng_stat *)0x0) {
        return pnVar2;
      }
    }
    stat_local = (nng_stat *)0x0;
  }
  return stat_local;
}

Assistant:

const nng_stat *
nng_stat_find_scope(const nng_stat *stat, const char *name, int id)
{
#if NNG_ENABLE_STATS
	nng_stat *child;
	if (stat == NULL || stat->s_info->si_type != NNG_STAT_SCOPE) {
		return (NULL);
	}
	if ((stat->s_val.sv_id == id) &&
	    (stat->s_info->si_type == NNG_STAT_SCOPE) &&
	    (strcmp(name, stat->s_info->si_name) == 0)) {
		return (stat);
	}
	NNI_LIST_FOREACH (&stat->s_children, child) {
		const nng_stat *result;
		if ((result = nng_stat_find_scope(child, name, id)) != NULL) {
			return (result);
		}
	}
#else
	NNI_ARG_UNUSED(stat);
	NNI_ARG_UNUSED(name);
	NNI_ARG_UNUSED(id);
#endif
	return (NULL);
}